

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O3

InlineReader * __thiscall adios2::core::engine::InlineWriter::GetReader(InlineWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IO *pIVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  Mode MVar5;
  long lVar6;
  InlineReader *pIVar7;
  shared_ptr<adios2::core::Engine> e;
  Engine *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pIVar2 = (this->super_Engine).m_IO;
  uVar3 = (pIVar2->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar3 != 1) {
    paVar1 = &local_48.field_2;
    if (2 < uVar3) {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"InlineWriter","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GetReader","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "There must be only one inline writer and at most one inline reader.","");
      helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    p_Var4 = (pIVar2->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8 = *(Engine **)(p_Var4 + 2);
    local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[2]._M_parent;
    if ((_Base_ptr)local_b0._M_pi != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent =
             *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent + 1;
      }
    }
    MVar5 = Engine::OpenMode(local_b8);
    if (MVar5 == Write) {
      lVar6 = std::_Rb_tree_decrement
                        (&(pIVar2->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header);
      local_b8 = *(Engine **)(lVar6 + 0x40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_b0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar6 + 0x48));
    }
    if ((local_b8 == (Engine *)0x0) ||
       (pIVar7 = (InlineReader *)
                 __dynamic_cast(local_b8,&Engine::typeinfo,&InlineReader::typeinfo,0),
       pIVar7 == (InlineReader *)0x0)) {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"InlineWriter","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GetReader","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "dynamic_cast<InlineReader*> failed; this is very likely a bug.","");
      helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      pIVar7 = (InlineReader *)0x0;
    }
    if ((_Base_ptr)local_b0._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
    }
    return pIVar7;
  }
  return (InlineReader *)0x0;
}

Assistant:

const InlineReader *InlineWriter::GetReader() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() == 1)
    {
        // it should be fine for a writer to be created and start running,
        // without the reader having been created. This is necessary to run
        // correctly with ParaView Catalyst Live.
        return nullptr;
    }
    else if (engine_map.size() > 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "GetReader",
                                          "There must be only one inline writer and at most "
                                          "one inline reader.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Write)
    {
        e = engine_map.rbegin()->second;
    }

    const auto reader = dynamic_cast<InlineReader *>(e.get());
    if (!reader)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineWriter", "GetReader",
            "dynamic_cast<InlineReader*> failed; this is very likely a bug.");
    }
    return reader;
}